

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  int extraout_EAX;
  uv_mutex_t *unaff_RBX;
  uv_mutex_t mutex;
  uv_thread_t uStack_90;
  uv_mutex_t *puStack_88;
  uv_rwlock_t uStack_78;
  uv_mutex_t *puStack_40;
  uv_mutex_t local_30;
  
  puStack_40 = (uv_mutex_t *)0x1619c0;
  iVar1 = uv_mutex_init_recursive(&local_30);
  if (iVar1 == 0) {
    unaff_RBX = &local_30;
    puStack_40 = (uv_mutex_t *)0x1619d1;
    uv_mutex_lock(unaff_RBX);
    puStack_40 = (uv_mutex_t *)0x1619d9;
    uv_mutex_lock(unaff_RBX);
    puStack_40 = (uv_mutex_t *)0x1619e1;
    iVar1 = uv_mutex_trylock(unaff_RBX);
    if (iVar1 == 0) {
      puStack_40 = (uv_mutex_t *)0x1619f2;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x1619fa;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x161a02;
      uv_mutex_unlock(&local_30);
      puStack_40 = (uv_mutex_t *)0x161a0a;
      uv_mutex_destroy(&local_30);
      return 0;
    }
  }
  else {
    puStack_40 = (uv_mutex_t *)0x161a17;
    run_test_thread_mutex_recursive_cold_1();
  }
  puStack_40 = (uv_mutex_t *)run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  puStack_88 = (uv_mutex_t *)0x161a2b;
  puStack_40 = unaff_RBX;
  iVar1 = uv_rwlock_init(&uStack_78);
  if (iVar1 == 0) {
    puStack_88 = (uv_mutex_t *)0x161a3c;
    uv_rwlock_rdlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161a44;
    uv_rwlock_rdunlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161a4c;
    uv_rwlock_wrlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161a54;
    uv_rwlock_wrunlock(&uStack_78);
    puStack_88 = (uv_mutex_t *)0x161a5c;
    uv_rwlock_destroy(&uStack_78);
    return 0;
  }
  puStack_88 = (uv_mutex_t *)run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  puStack_88 = unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  if (iVar1 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    if (iVar1 != 0) goto LAB_00161bcc;
    iVar1 = uv_rwlock_init(&rwlock);
    if (iVar1 != 0) goto LAB_00161bd1;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(&uStack_90,thread_rwlock_trylock_peer,(void *)0x0);
    if (iVar1 != 0) goto LAB_00161bd6;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161bdb;
    synchronize();
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161be0;
    synchronize();
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161be5;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161bea;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161bef;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161bf4;
    synchronize();
    iVar1 = uv_thread_join(&uStack_90);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_00161bcc:
    run_test_thread_rwlock_trylock_cold_2();
LAB_00161bd1:
    run_test_thread_rwlock_trylock_cold_3();
LAB_00161bd6:
    run_test_thread_rwlock_trylock_cold_4();
LAB_00161bdb:
    run_test_thread_rwlock_trylock_cold_5();
LAB_00161be0:
    run_test_thread_rwlock_trylock_cold_6();
LAB_00161be5:
    run_test_thread_rwlock_trylock_cold_7();
LAB_00161bea:
    run_test_thread_rwlock_trylock_cold_8();
LAB_00161bef:
    run_test_thread_rwlock_trylock_cold_9();
LAB_00161bf4:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161cd4;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161cd9;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161cde;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_wrunlock(&rwlock);
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        synchronize();
        uv_rwlock_rdunlock(&rwlock);
        step = step + 1;
        uv_cond_signal(&condvar);
        uv_mutex_unlock(&::mutex);
        return extraout_EAX;
      }
      goto LAB_00161ce8;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_00161cd4:
    thread_rwlock_trylock_peer_cold_2();
LAB_00161cd9:
    thread_rwlock_trylock_peer_cold_3();
LAB_00161cde:
    thread_rwlock_trylock_peer_cold_4();
  }
  thread_rwlock_trylock_peer_cold_5();
LAB_00161ce8:
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&::mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return step;
  }
  synchronize_cold_1();
  return 0;
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT(0 == uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}